

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_897d::ShadowedART::assertLowerBoundValid(ShadowedART *this,Key key)

{
  bool bVar1;
  iterator iVar2;
  int line;
  _Base_ptr __one;
  char *expression;
  art_iterator_t art_it;
  string local_100;
  key_type local_e0;
  Key local_d6;
  string local_d0;
  art_iterator_t local_b0;
  
  local_e0.key_._M_elems._0_4_ = key.key_._M_elems._0_4_;
  local_e0.key_._M_elems._4_2_ = key.key_._M_elems._4_2_;
  iVar2 = std::
          map<(anonymous_namespace)::Key,_unsigned_long,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_unsigned_long>_>_>
          ::lower_bound(&this->shadow_,&local_e0);
  art_lower_bound(&local_b0,(art_t *)&this->art_,(art_key_chunk_t *)&local_e0);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->shadow_)._M_t._M_impl.super__Rb_tree_header) {
    if (local_b0.value == (art_val_t *)0x0) {
      return;
    }
    puts("Iterator is not null");
    bVar1 = local_b0.value == (art_val_t *)0x0;
    expression = "art_it->value == nullptr";
    line = 0x8f;
  }
  else {
    if (local_b0.value == (art_val_t *)0x0) {
      (anonymous_namespace)::Key::string_abi_cxx11_(&local_100,iVar2._M_node + 1);
      printf("Iterator for key %s is null\n",local_100._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_100);
      _assert_true((ulong)(local_b0.value != (art_val_t *)0x0),"art_it->value != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                   ,0x8b);
    }
    __one = iVar2._M_node + 1;
    Key::Key((Key *)&local_100,local_b0.key);
    bVar1 = std::operator==((array<unsigned_char,_6UL> *)__one,
                            (array<unsigned_char,_6UL> *)&local_100);
    if (bVar1) {
      return;
    }
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_100,__one);
    Key::Key(&local_d6,local_b0.key);
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_d0,&local_d6);
    printf("Shadow iterator key = %s, ART key = %s\n",local_100._M_dataplus._M_p,
           local_d0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_100);
    Key::Key((Key *)&local_100,local_b0.key);
    bVar1 = std::operator==((array<unsigned_char,_6UL> *)__one,
                            (array<unsigned_char,_6UL> *)&local_100);
    expression = "shadow_it->first == Key(art_it->key)";
    line = 0x96;
  }
  _assert_true((ulong)bVar1,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,line);
  return;
}

Assistant:

void assertLowerBoundValid(Key key) {
        auto shadow_it = shadow_.lower_bound(key);
        auto art_it = art_lower_bound(&art_, key.data());
        assertIteratorValid(shadow_it, &art_it);
    }